

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_user.h
# Opt level: O2

void __thiscall fineftp::FtpUser::~FtpUser(FtpUser *this)

{
  ::std::__cxx11::string::~string((string *)&this->local_root_path_);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

FtpUser(const std::string& password, const std::string& local_root_path, const Permission permissions)
      : password_       (password)
      , local_root_path_(local_root_path)
      , permissions_    (permissions)
    {}